

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O1

ResetPtr __thiscall libcellml::Component::reset(Component *this,size_t index)

{
  size_type *psVar1;
  long lVar2;
  EntityImpl *pEVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  ResetPtr RVar4;
  ResetPtr RVar5;
  ResetPtr RVar6;
  
  lVar2 = *(long *)(*(long *)(index + 8) + 0xb0);
  if (in_RDX._M_pi <
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      (*(long *)(*(long *)(index + 8) + 0xb8) - lVar2 >> 4)) {
    in_RDX._M_pi = in_RDX._M_pi * 0x10;
    (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity =
         *(_func_int ***)((long)&(in_RDX._M_pi)->_vptr__Sp_counted_base + lVar2);
    pEVar3 = *(EntityImpl **)((long)&(in_RDX._M_pi)->_M_use_count + lVar2);
    (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl =
         pEVar3;
    if (pEVar3 != (EntityImpl *)0x0) {
      if (__libc_single_threaded != '\0') {
        psVar1 = &(pEVar3->mId)._M_string_length;
        *(int *)psVar1 = (int)*psVar1 + 1;
        RVar4.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
        RVar4.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)this;
        return (ResetPtr)RVar4.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>;
      }
      LOCK();
      psVar1 = &(pEVar3->mId)._M_string_length;
      *(int *)psVar1 = (int)*psVar1 + 1;
      UNLOCK();
      RVar6.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      RVar6.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (ResetPtr)RVar6.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>;
    }
  }
  else {
    (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity =
         (_func_int **)0x0;
    (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl =
         (EntityImpl *)0x0;
  }
  RVar5.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  RVar5.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ResetPtr)RVar5.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ResetPtr Component::reset(size_t index) const
{
    if (index < pFunc()->mResets.size()) {
        return pFunc()->mResets.at(index);
    }

    return nullptr;
}